

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidatePushElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  xmlRegExecCtxtPtr exec_00;
  xmlRelaxNGDefinePtr_conflict define;
  xmlRegExecCtxtPtr exec;
  xmlRelaxNGGrammarPtr_conflict grammar;
  xmlRelaxNGPtr schema;
  int ret;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (elem == (xmlNodePtr)0x0)) {
    return -1;
  }
  if (ctxt->elem == (xmlRegExecCtxtPtr)0x0) {
    if (ctxt->schema == (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
      return -1;
    }
    pxVar1 = ctxt->schema->topgrammar;
    if ((pxVar1 == (xmlRelaxNGGrammarPtr_conflict)0x0) ||
       (pxVar1->start == (xmlRelaxNGDefinePtr_conflict)0x0)) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
      return -1;
    }
    pxVar2 = pxVar1->start;
    if (pxVar2->contModel == (xmlRegexpPtr)0x0) {
      ctxt->pdef = pxVar2;
      return 0;
    }
    exec_00 = xmlRegNewExecCtxt(pxVar2->contModel,xmlRelaxNGValidateProgressiveCallback,ctxt);
    if (exec_00 == (xmlRegExecCtxtPtr)0x0) {
      return -1;
    }
    xmlRelaxNGElemPush(ctxt,exec_00);
  }
  ctxt->pnode = elem;
  ctxt->pstate = 0;
  if (elem->ns == (xmlNs *)0x0) {
    schema._4_4_ = xmlRegExecPushString(ctxt->elem,elem->name,ctxt);
  }
  else {
    schema._4_4_ = xmlRegExecPushString2(ctxt->elem,elem->name,elem->ns->href,ctxt);
  }
  if (schema._4_4_ < 0) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMWRONG,elem->name,(xmlChar *)0x0,0);
  }
  else if (ctxt->pstate == 0) {
    schema._4_4_ = 0;
  }
  else if (ctxt->pstate < 0) {
    schema._4_4_ = -1;
  }
  else {
    schema._4_4_ = 1;
  }
  return schema._4_4_;
}

Assistant:

int
xmlRelaxNGValidatePushElement(xmlRelaxNGValidCtxtPtr ctxt,
                              xmlDocPtr doc ATTRIBUTE_UNUSED,
                              xmlNodePtr elem)
{
    int ret = 1;

    if ((ctxt == NULL) || (elem == NULL))
        return (-1);

#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "PushElem %s\n", elem->name);
#endif
    if (ctxt->elem == 0) {
        xmlRelaxNGPtr schema;
        xmlRelaxNGGrammarPtr grammar;
        xmlRegExecCtxtPtr exec;
        xmlRelaxNGDefinePtr define;

        schema = ctxt->schema;
        if (schema == NULL) {
            VALID_ERR(XML_RELAXNG_ERR_NOGRAMMAR);
            return (-1);
        }
        grammar = schema->topgrammar;
        if ((grammar == NULL) || (grammar->start == NULL)) {
            VALID_ERR(XML_RELAXNG_ERR_NOGRAMMAR);
            return (-1);
        }
        define = grammar->start;
        if (define->contModel == NULL) {
            ctxt->pdef = define;
            return (0);
        }
        exec = xmlRegNewExecCtxt(define->contModel,
                                 xmlRelaxNGValidateProgressiveCallback,
                                 ctxt);
        if (exec == NULL) {
            return (-1);
        }
        xmlRelaxNGElemPush(ctxt, exec);
    }
    ctxt->pnode = elem;
    ctxt->pstate = 0;
    if (elem->ns != NULL) {
        ret =
            xmlRegExecPushString2(ctxt->elem, elem->name, elem->ns->href,
                                  ctxt);
    } else {
        ret = xmlRegExecPushString(ctxt->elem, elem->name, ctxt);
    }
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMWRONG, elem->name);
    } else {
        if (ctxt->pstate == 0)
            ret = 0;
        else if (ctxt->pstate < 0)
            ret = -1;
        else
            ret = 1;
    }
#ifdef DEBUG_PROGRESSIVE
    if (ret < 0)
        xmlGenericError(xmlGenericErrorContext, "PushElem %s failed\n",
                        elem->name);
#endif
    return (ret);
}